

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

golf_shader_uniform_t * golf_shader_vs_uniform_setup(golf_shader_t *shader,char *name,int n,...)

{
  char *name_00;
  ulong uVar1;
  mat4 m;
  vec2 v;
  vec4 v_00;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  char *pcStack_a8;
  golf_shader_uniform_value_t value;
  int local_4c;
  int i;
  va_list args;
  golf_shader_uniform_t *uniform;
  int n_local;
  char *name_local;
  golf_shader_t *shader_local;
  
  shader_local = (golf_shader_t *)golf_shader_get_vs_uniform(shader,name);
  if (shader_local == (golf_shader_t *)0x0) {
    shader_local = (golf_shader_t *)0x0;
  }
  else {
    args[0]._0_8_ = &stack0x00000008;
    for (local_4c = 0; local_4c < n; local_4c = local_4c + 1) {
      value.field_2._44_8_ = *(undefined8 *)(args[0]._0_8_ + 0x40);
      value.field_2._52_8_ = *(undefined8 *)(args[0]._0_8_ + 0x48);
      name_00 = *(char **)args[0]._0_8_;
      uVar1 = *(ulong *)(args[0]._0_8_ + 8);
      value.field_2._12_8_ = *(undefined8 *)(args[0]._0_8_ + 0x20);
      value.field_2._20_8_ = *(undefined8 *)(args[0]._0_8_ + 0x28);
      value.field_2._28_8_ = *(undefined8 *)(args[0]._0_8_ + 0x30);
      value.field_2._36_8_ = *(undefined8 *)(args[0]._0_8_ + 0x38);
      value.type = (golf_shader_uniform_value_type_t)*(undefined8 *)(args[0]._0_8_ + 0x10);
      value.field_2.f = (float)((ulong)*(undefined8 *)(args[0]._0_8_ + 0x10) >> 0x20);
      value.field_2.v2.y = (float)*(undefined8 *)(args[0]._0_8_ + 0x18);
      value.field_2.v4.z = (float)((ulong)*(undefined8 *)(args[0]._0_8_ + 0x18) >> 0x20);
      value.name._0_4_ = (undefined4)uVar1;
      value.name._4_4_ = (float)(uVar1 >> 0x20);
      pcStack_a8 = name_00;
      switch(uVar1 & 0xffffffff) {
      case 0:
        golf_shader_uniform_set_float
                  ((golf_shader_uniform_t *)shader_local,name_00,value.name._4_4_);
        break;
      case 1:
        v.y = (float)value.type;
        v.x = value.name._4_4_;
        golf_shader_uniform_set_vec2((golf_shader_uniform_t *)shader_local,name_00,v);
        break;
      case 2:
        v_00.y = (float)value.type;
        v_00.x = value.name._4_4_;
        v_00.z = value.field_2.f;
        v_00.w = value.field_2.v2.y;
        golf_shader_uniform_set_vec4((golf_shader_uniform_t *)shader_local,name_00,v_00);
        break;
      case 3:
        memcpy(&local_e8,(void *)((long)&value.name + 4),0x40);
        m.m[2] = (float)(undefined4)uStack_e0;
        m.m[3] = (float)uStack_e0._4_4_;
        m.m[0] = (float)(undefined4)local_e8;
        m.m[1] = (float)local_e8._4_4_;
        m.m[4] = (float)(undefined4)local_d8;
        m.m[5] = (float)local_d8._4_4_;
        m.m[6] = (float)(undefined4)uStack_d0;
        m.m[7] = (float)uStack_d0._4_4_;
        m.m[8] = (float)(undefined4)local_c8;
        m.m[9] = (float)local_c8._4_4_;
        m.m[10] = (float)(undefined4)uStack_c0;
        m.m[0xb] = (float)uStack_c0._4_4_;
        m.m[0xc] = (float)(undefined4)local_b8;
        m.m[0xd] = (float)local_b8._4_4_;
        m.m[0xe] = (float)(undefined4)uStack_b0;
        m.m[0xf] = (float)uStack_b0._4_4_;
        golf_shader_uniform_set_mat4((golf_shader_uniform_t *)shader_local,name_00,m);
      }
      args[0]._0_8_ = args[0]._0_8_ + 0x50;
    }
  }
  return (golf_shader_uniform_t *)shader_local;
}

Assistant:

golf_shader_uniform_t *golf_shader_vs_uniform_setup(golf_shader_t *shader, const char *name, int n, ...) {
    golf_shader_uniform_t *uniform = golf_shader_get_vs_uniform(shader, name);
    if (!uniform) {
        return NULL;
    }

    va_list args;
    va_start(args, n);
    for (int i = 0; i < n; i++) {
        golf_shader_uniform_value_t value = va_arg(args, golf_shader_uniform_value_t);
        switch (value.type) {
            case GOLF_SHADER_UNIFORM_VALUE_FLOAT:
                golf_shader_uniform_set_float(uniform, value.name, value.f);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_VEC2:
                golf_shader_uniform_set_vec2(uniform, value.name, value.v2);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_VEC4:
                golf_shader_uniform_set_vec4(uniform, value.name, value.v4);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_MAT4:
                golf_shader_uniform_set_mat4(uniform, value.name, value.m4);
                break;
        }
    }
    va_end(args);

    return uniform;
}